

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_io.cpp
# Opt level: O2

int SaveEXR(float *rgb,int width,int height,char *outfilename)

{
  int iVar1;
  char *__dest;
  void *__ptr;
  void *__ptr_00;
  size_type __new_size;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  int i;
  float *pfVar5;
  ulong uVar6;
  char *err;
  char *outfilename_local;
  EXRImage EStack_10948;
  vector<float,_std::allocator<float>_> images [3];
  float *image_ptr [3];
  EXRHeader header;
  
  outfilename_local = outfilename;
  memset(&header,0,0x10890);
  EStack_10948.tiles = (EXRTile *)0x0;
  EStack_10948.images = (uchar **)0x0;
  EStack_10948.width = 0;
  EStack_10948.height = 0;
  EStack_10948.num_channels = 3;
  images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar3 = height * width;
  __new_size = (size_type)(int)uVar3;
  std::vector<float,_std::allocator<float>_>::resize(images,__new_size);
  std::vector<float,_std::allocator<float>_>::resize(images + 1,__new_size);
  std::vector<float,_std::allocator<float>_>::resize(images + 2,__new_size);
  uVar2 = 0;
  uVar6 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar6 = uVar2;
  }
  pfVar5 = rgb + 2;
  for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar2] = pfVar5[-2];
    images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar2] = pfVar5[-1];
    images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar2] = *pfVar5;
    pfVar5 = pfVar5 + 3;
  }
  image_ptr[0] = std::vector<float,_std::allocator<float>_>::at(images + 2,0);
  image_ptr[1] = std::vector<float,_std::allocator<float>_>::at(images + 1,0);
  image_ptr[2] = std::vector<float,_std::allocator<float>_>::at(images,0);
  EStack_10948.images = (uchar **)image_ptr;
  EStack_10948.height = height;
  EStack_10948.width = width;
  __dest = (char *)malloc(0x330);
  strncpy(__dest,"B",0xff);
  __dest[1] = '\0';
  strncpy(__dest + 0x110,"G",0xff);
  __dest[0x111] = '\0';
  strncpy(__dest + 0x220,"R",0xff);
  __dest[0x221] = '\0';
  __ptr = malloc(0xc);
  __ptr_00 = malloc(0xc);
  for (uVar6 = 0; uVar6 < 3; uVar6 = uVar6 + 1) {
    *(undefined4 *)((long)__ptr + uVar6 * 4) = 2;
    *(undefined4 *)((long)__ptr_00 + uVar6 * 4) = 1;
  }
  err = (char *)0x0;
  iVar1 = SaveEXRImageToFile(&EStack_10948,&header,outfilename,&err);
  if (iVar1 == 0) {
    github111116::ConsoleLogger::info<char[16],char_const*>
              (&console,(char (*) [16])"Saved exr file ",&outfilename_local);
    free(__dest);
    free(__ptr);
    free(__ptr_00);
  }
  else {
    fprintf(_stderr,"Save EXR err: %s\n",err);
  }
  lVar4 = 0x30;
  do {
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)
               ((long)&images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return iVar1;
}

Assistant:

int SaveEXR(const float* rgb, int width, int height, const char* outfilename) {

  EXRHeader header;
  InitEXRHeader(&header);

  EXRImage image;
  InitEXRImage(&image);

  image.num_channels = 3;

  std::vector<float> images[3];
  images[0].resize(width * height);
  images[1].resize(width * height);
  images[2].resize(width * height);

  // Split RGBRGBRGB... into R, G and B layer
  for (int i = 0; i < width * height; i++) {
    images[0][i] = rgb[3*i+0];
    images[1][i] = rgb[3*i+1];
    images[2][i] = rgb[3*i+2];
  }

  float* image_ptr[3];
  image_ptr[0] = &(images[2].at(0)); // B
  image_ptr[1] = &(images[1].at(0)); // G
  image_ptr[2] = &(images[0].at(0)); // R

  image.images = (unsigned char**)image_ptr;
  image.width = width;
  image.height = height;

  header.num_channels = 3;
  header.channels = (EXRChannelInfo *)malloc(sizeof(EXRChannelInfo) * header.num_channels);
  // Must be (A)BGR order, since most of EXR viewers expect this channel order.
  strncpy(header.channels[0].name, "B", 255); header.channels[0].name[strlen("B")] = '\0';
  strncpy(header.channels[1].name, "G", 255); header.channels[1].name[strlen("G")] = '\0';
  strncpy(header.channels[2].name, "R", 255); header.channels[2].name[strlen("R")] = '\0';

  header.pixel_types = (int *)malloc(sizeof(int) * header.num_channels);
  header.requested_pixel_types = (int *)malloc(sizeof(int) * header.num_channels);
  for (int i = 0; i < header.num_channels; i++) {
    header.pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT; // pixel type of input image
    header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_HALF; // pixel type of output image to be stored in .EXR
  }

  const char* err = NULL; // or nullptr in C++11 or later.
  int ret = SaveEXRImageToFile(&image, &header, outfilename, &err);
  if (ret != TINYEXR_SUCCESS) {
    fprintf(stderr, "Save EXR err: %s\n", err);
    // FreeEXRErrorMessage(err); // free's buffer for an error message
    return ret;
  }
  console.info("Saved exr file ", outfilename);

  // free(rgb);

  free(header.channels);
  free(header.pixel_types);
  free(header.requested_pixel_types);

  return TINYEXR_SUCCESS;
}